

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O1

void __thiscall Jupiter::GenericCommand::~GenericCommand(GenericCommand *this)

{
  pointer *pppGVar1;
  _Atomic_word *p_Var2;
  GenericCommandNamespace *pGVar3;
  pointer ppGVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer ppPVar6;
  int iVar7;
  size_t __n;
  pointer __dest;
  Plugin **plugin;
  pointer ppPVar8;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_00147210;
  pGVar3 = this->m_parent;
  ppPVar8 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar6 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pGVar3 != (GenericCommandNamespace *)0x0) {
    __dest = (pGVar3->m_commands).
             super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppGVar4 = (pGVar3->m_commands).
              super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (__dest != ppGVar4) {
      __n = (long)ppGVar4 - (long)__dest;
      do {
        __n = __n - 8;
        if (*__dest == this) {
          if (__dest + 1 != ppGVar4) {
            memmove(__dest,__dest + 1,__n);
          }
          pppGVar1 = &(pGVar3->m_commands).
                      super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppGVar1 = *pppGVar1 + -1;
          pGVar3->m_should_update_help = true;
          ppPVar8 = g_plugins.
                    super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppPVar6 = g_plugins.
                    super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          break;
        }
        __dest = __dest + 1;
      } while (__dest != ppGVar4);
    }
  }
  for (; ppPVar8 != ppPVar6; ppPVar8 = ppPVar8 + 1) {
    (*((*ppPVar8)->super_Thinker)._vptr_Thinker[0x1b])(*ppPVar8,this);
  }
  p_Var5 = (this->super_enable_shared_from_this<Jupiter::GenericCommand>)._M_weak_this.
           super___weak_ptr<Jupiter::GenericCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &p_Var5->_M_weak_count;
      iVar7 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar7 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_001472f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_Command).m_triggers);
  return;
}

Assistant:

Jupiter::GenericCommand::~GenericCommand() {
	// Inform the parent
	if (GenericCommand::m_parent != nullptr) {
		GenericCommand::m_parent->removeCommand(*this);
	}

	// Notify plugins
	for (auto& plugin : Jupiter::plugins) {
		plugin->OnGenericCommandRemove(*this);
	}
}